

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkcell.c
# Opt level: O1

LispPTR N_OP_createcell(LispPTR tos)

{
  int *piVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  DLword *pDVar5;
  LispPTR LVar6;
  LispPTR *base;
  ulong uVar7;
  DLword *pDVar8;
  uint uVar9;
  
  pDVar5 = DTDspace;
  if ((tos & 0xfff0000) == 0xe0000) {
    uVar9 = (tos & 0xffff) << 5;
    if (*(short *)((long)DTDspace + (ulong)(ushort)tos * 4 + (ulong)uVar9 + 4) != 0) {
      uVar7 = (ulong)((tos & 0xffff) + (tos & 0xffff));
      uVar3 = *(uint *)((long)DTDspace + uVar7 * 2 + (ulong)uVar9 + 8);
      pDVar8 = Lisp_world;
      while (uVar3 = uVar3 & 0xfffffff, Lisp_world = pDVar8, uVar3 == 0) {
        base = alloc_mdspage(*(short *)((long)pDVar5 + uVar7 * 2 + (ulong)uVar9 + 0x22));
        LVar6 = initmdspage(base,*(DLword *)((long)pDVar5 + uVar7 * 2 + (ulong)uVar9 + 4),0);
        *(LispPTR *)((long)pDVar5 + uVar7 * 2 + (ulong)uVar9 + 8) = LVar6;
        if ((LVar6 >> 0x1b & 1) != 0) {
          error("bad entry on free chain.");
        }
        pDVar8 = Lisp_world;
        uVar3 = *(uint *)((long)pDVar5 + uVar7 * 2 + (ulong)uVar9 + 8);
      }
      if (*(int *)(pDVar8 + uVar3) == 0xe0001) {
        error("N_OP_createcell E0001 error");
      }
      uVar4 = *(uint *)(pDVar8 + uVar3);
      *(uint *)((long)pDVar5 + uVar7 * 2 + (ulong)uVar9 + 8) = uVar4 & 0xfffffff;
      if ((uVar4 & 0x8000001) != 0) {
        error("bad entry on free chain.");
      }
      piVar1 = (int *)((long)pDVar5 + uVar7 * 2 + (ulong)uVar9 + 0x18);
      *piVar1 = *piVar1 + 1;
      uVar2 = *(ushort *)((long)pDVar5 + uVar7 * 2 + (ulong)uVar9 + 4);
      if (uVar2 != 0) {
        pDVar8 = pDVar8 + uVar3;
        uVar7 = (ulong)((uint)uVar2 * 2);
        do {
          *(undefined2 *)((ulong)pDVar8 ^ 2) = 0;
          pDVar8 = pDVar8 + 1;
          uVar7 = uVar7 - 2;
        } while (uVar7 != 0);
      }
      if (*(short *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) < 0) {
        return uVar3;
      }
      if (*GcDisabled_word == 0x4c) {
        return uVar3;
      }
      if (*Reclaim_cnt_word != 0) {
        htfind(uVar3,1);
        return uVar3;
      }
      rec_htfind(uVar3,1);
      return uVar3;
    }
  }
  MachineState.errorexit = 1;
  MachineState.tosvalue = tos;
  return 0xffffffff;
}

Assistant:

LispPTR N_OP_createcell(LispPTR tos) {
  struct dtd *dtd68k;
  DLword *ptr, *lastptr;
  LispPTR newcell;
  unsigned int type;

  if ((tos & SEGMASK) != S_POSITIVE) ERROR_EXIT(tos);
  type = tos & 0xffff;

#ifdef DTDDEBUG
  if (type == TYPE_LISTP) error("N_OP_createcell : Can't create Listp cell with CREATECELL");
  check_dtd_chain(type);
#endif

  dtd68k = (struct dtd *)GetDTD(type);

  oldoldfree = oldfree;
  oldfree = dtd68k->dtd_free;

  if (dtd68k->dtd_size == 0) ERROR_EXIT(tos);
/* error("OP_createcell : Attempt to create a cell not declared yet"); */

retry:
  if ((tos = newcell = ((dtd68k->dtd_free) & POINTERMASK)) != NIL) {
    ptr = (DLword *)NativeAligned2FromLAddr(newcell);
    if (917505 == *(LispPTR *)ptr) error("N_OP_createcell E0001 error");
    /* replace dtd_free with newcell's top DLword (it may keep next chain)*/
    dtd68k->dtd_free = (*((LispPTR *)ptr)) & POINTERMASK;
    if (dtd68k->dtd_free & 0x8000001) error("bad entry on free chain.");

    dtd68k->dtd_oldcnt++;

    /* clear 0  */
    for (lastptr = ptr + dtd68k->dtd_size; ptr != lastptr; ptr++) { GETWORD(ptr) = 0; }

    /*	 IncAllocCnt(1); */
    GCLOOKUP(tos, DELREF);
    return (tos);
  } else {
    dtd68k->dtd_free = initmdspage(alloc_mdspage(dtd68k->dtd_typeentry), dtd68k->dtd_size, NIL);
    if (dtd68k->dtd_free & 0x8000000) error("bad entry on free chain.");
    goto retry;
  }

}